

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkUtil.c
# Opt level: O2

void Nwk_ManDumpBlif(Nwk_Man_t *pNtk,char *pFileName,Vec_Ptr_t *vPiNames,Vec_Ptr_t *vPoNames)

{
  Nwk_Obj_t *p;
  int iVar1;
  uint uVar2;
  int iVar3;
  FILE *__s;
  void *pvVar4;
  Aig_MmFlex_t *p_00;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  Vec_Ptr_t *p_03;
  uint *pTruth;
  ulong uVar5;
  char *__s_00;
  void *pvVar6;
  ulong uVar7;
  long lVar8;
  
  iVar1 = Nwk_ManPoNum(pNtk);
  if (iVar1 == 0) {
    puts("Nwk_ManDumpBlif(): Network does not have POs.");
    return;
  }
  uVar2 = Abc_Base10Log(pNtk->vObjs->nSize);
  __s = fopen(pFileName,"w");
  fwrite("# BLIF file written by procedure Nwk_ManDumpBlif()\n",0x33,1,__s);
  fprintf(__s,".model %s\n",pNtk->pName);
  fwrite(".inputs",7,1,__s);
  for (iVar1 = 0; iVar1 < pNtk->vCis->nSize; iVar1 = iVar1 + 1) {
    pvVar4 = Vec_PtrEntry(pNtk->vCis,iVar1);
    if (vPiNames == (Vec_Ptr_t *)0x0) {
      fprintf(__s," n%0*d",(ulong)uVar2,(ulong)*(uint *)((long)pvVar4 + 0x24));
    }
    else {
      pvVar4 = Vec_PtrEntry(vPiNames,iVar1);
      fprintf(__s," %s",pvVar4);
    }
  }
  fputc(10,__s);
  fwrite(".outputs",8,1,__s);
  for (iVar1 = 0; iVar1 < pNtk->vCos->nSize; iVar1 = iVar1 + 1) {
    pvVar4 = Vec_PtrEntry(pNtk->vCos,iVar1);
    if (vPoNames == (Vec_Ptr_t *)0x0) {
      fprintf(__s," n%0*d",(ulong)uVar2,(ulong)*(uint *)((long)pvVar4 + 0x24));
    }
    else {
      pvVar4 = Vec_PtrEntry(vPoNames,iVar1);
      fprintf(__s," %s",pvVar4);
    }
  }
  fputc(10,__s);
  p_00 = Aig_MmFlexStart();
  p_01 = Vec_IntAlloc(0x10000);
  p_02 = Vec_IntAlloc(0x10000);
  p_03 = Nwk_ManDfs(pNtk);
  iVar1 = 0;
  do {
    if (p_03->nSize <= iVar1) {
      Vec_IntFree(p_02);
      Vec_IntFree(p_01);
      free(p_03->pArray);
      free(p_03);
      Aig_MmFlexStop(p_00,0);
      for (iVar1 = 0; iVar1 < pNtk->vCos->nSize; iVar1 = iVar1 + 1) {
        pvVar4 = Vec_PtrEntry(pNtk->vCos,iVar1);
        fwrite(".names",6,1,__s);
        if ((vPiNames == (Vec_Ptr_t *)0x0) ||
           (iVar3 = Nwk_ObjIsPi((Nwk_Obj_t *)**(undefined8 **)((long)pvVar4 + 0x48)), iVar3 == 0)) {
          fprintf(__s," n%0*d",(ulong)uVar2,
                  (ulong)*(uint *)(**(long **)((long)pvVar4 + 0x48) + 0x24));
        }
        else {
          pvVar6 = Vec_PtrEntry(vPiNames,*(uint *)(**(long **)((long)pvVar4 + 0x48) + 0x20) >> 7);
          fprintf(__s," %s",pvVar6);
        }
        if (vPoNames == (Vec_Ptr_t *)0x0) {
          fprintf(__s," n%0*d\n",(ulong)uVar2,(ulong)*(uint *)((long)pvVar4 + 0x24));
        }
        else {
          pvVar6 = Vec_PtrEntry(vPoNames,*(uint *)((long)pvVar4 + 0x20) >> 7);
          fprintf(__s," %s\n",pvVar6);
        }
        fprintf(__s,"%d 1\n",(ulong)((*(byte *)((long)pvVar4 + 0x20) & 8) == 0));
      }
      fwrite(".end\n\n",6,1,__s);
      fclose(__s);
      return;
    }
    pvVar4 = Vec_PtrEntry(p_03,iVar1);
    if ((*(uint *)((long)pvVar4 + 0x20) & 7) == 3) {
      pTruth = Hop_ManConvertAigToTruth
                         (pNtk->pManHop,
                          (Hop_Obj_t *)(*(ulong *)((long)pvVar4 + 8) & 0xfffffffffffffffe),
                          *(int *)((long)pvVar4 + 0x3c),p_01,0);
      iVar3 = *(int *)((long)pvVar4 + 0x3c);
      if ((*(byte *)((long)pvVar4 + 8) & 1) != 0) {
        uVar5 = (ulong)(uint)(1 << ((char)iVar3 - 5U & 0x1f));
        if (iVar3 < 6) {
          uVar5 = 1;
        }
        for (; 0 < (int)uVar5; uVar5 = uVar5 - 1) {
          pTruth[uVar5 - 1] = ~pTruth[uVar5 - 1];
        }
        iVar3 = *(int *)((long)pvVar4 + 0x3c);
      }
      __s_00 = Kit_PlaFromTruth(p_00,pTruth,iVar3,p_02);
      fwrite(".names",6,1,__s);
      iVar3 = *(int *)((long)pvVar4 + 0x3c);
      uVar5 = (ulong)(uint)(1 << ((char)iVar3 - 5U & 0x1f));
      uVar7 = uVar5;
      if (iVar3 < 6) {
        uVar5 = 1;
        uVar7 = uVar5;
      }
      do {
        if ((int)uVar5 < 1) goto LAB_0041a238;
        lVar8 = uVar5 - 1;
        uVar5 = uVar5 - 1;
      } while (pTruth[lVar8] == 0);
      do {
        if ((int)uVar7 < 1) goto LAB_0041a238;
        lVar8 = uVar7 - 1;
        uVar7 = uVar7 - 1;
      } while (pTruth[lVar8] == 0xffffffff);
      for (lVar8 = 0;
          (lVar8 < iVar3 &&
          (p = *(Nwk_Obj_t **)(*(long *)((long)pvVar4 + 0x48) + lVar8 * 8), p != (Nwk_Obj_t *)0x0));
          lVar8 = lVar8 + 1) {
        if ((vPiNames == (Vec_Ptr_t *)0x0) || (iVar3 = Nwk_ObjIsPi(p), iVar3 == 0)) {
          fprintf(__s," n%0*d",(ulong)uVar2,(ulong)(uint)p->Id);
        }
        else {
          pvVar6 = Vec_PtrEntry(vPiNames,*(uint *)&p->field_0x20 >> 7);
          fprintf(__s," %s",pvVar6);
        }
        iVar3 = *(int *)((long)pvVar4 + 0x3c);
      }
LAB_0041a238:
      fprintf(__s," n%0*d\n",(ulong)uVar2,(ulong)*(uint *)((long)pvVar4 + 0x24));
      fputs(__s_00,__s);
    }
    iVar1 = iVar1 + 1;
  } while( true );
}

Assistant:

void Nwk_ManDumpBlif( Nwk_Man_t * pNtk, char * pFileName, Vec_Ptr_t * vPiNames, Vec_Ptr_t * vPoNames )
{
    FILE * pFile;
    Vec_Ptr_t * vNodes;
    Vec_Int_t * vTruth;
    Vec_Int_t * vCover;
    Nwk_Obj_t * pObj, * pFanin;
    Aig_MmFlex_t * pMem;
    char * pSop = NULL;
    unsigned * pTruth;
    int i, k, nDigits;
    if ( Nwk_ManPoNum(pNtk) == 0 )
    {
        printf( "Nwk_ManDumpBlif(): Network does not have POs.\n" );
        return;
    }
    // collect nodes in the DFS order
    nDigits = Abc_Base10Log( Nwk_ManObjNumMax(pNtk) );
    // write the file 
    pFile = fopen( pFileName, "w" );
    fprintf( pFile, "# BLIF file written by procedure Nwk_ManDumpBlif()\n" );
//    fprintf( pFile, "# http://www.eecs.berkeley.edu/~alanmi/abc/\n" );
    fprintf( pFile, ".model %s\n", pNtk->pName );
    // write PIs
    fprintf( pFile, ".inputs" );
    Nwk_ManForEachCi( pNtk, pObj, i )
        if ( vPiNames )
            fprintf( pFile, " %s", (char*)Vec_PtrEntry(vPiNames, i) );
        else
            fprintf( pFile, " n%0*d", nDigits, pObj->Id );
    fprintf( pFile, "\n" );
    // write POs
    fprintf( pFile, ".outputs" );
    Nwk_ManForEachCo( pNtk, pObj, i )
        if ( vPoNames )
            fprintf( pFile, " %s", (char*)Vec_PtrEntry(vPoNames, i) );
        else
            fprintf( pFile, " n%0*d", nDigits, pObj->Id );
    fprintf( pFile, "\n" );
    // write nodes
    pMem = Aig_MmFlexStart();
    vTruth = Vec_IntAlloc( 1 << 16 );
    vCover = Vec_IntAlloc( 1 << 16 );
    vNodes = Nwk_ManDfs( pNtk );
    Vec_PtrForEachEntry( Nwk_Obj_t *, vNodes, pObj, i )
    {
        if ( !Nwk_ObjIsNode(pObj) )
            continue;
        // derive SOP for the AIG
        pTruth = Hop_ManConvertAigToTruth( pNtk->pManHop, Hop_Regular(pObj->pFunc), Nwk_ObjFaninNum(pObj), vTruth, 0 );
        if ( Hop_IsComplement(pObj->pFunc) )
            Kit_TruthNot( pTruth, pTruth, Nwk_ObjFaninNum(pObj) );
        pSop = Kit_PlaFromTruth( pMem, pTruth, Nwk_ObjFaninNum(pObj), vCover );
        // write the node
        fprintf( pFile, ".names" );
        if ( !Kit_TruthIsConst0(pTruth, Nwk_ObjFaninNum(pObj)) && !Kit_TruthIsConst1(pTruth, Nwk_ObjFaninNum(pObj)) )
        {
            Nwk_ObjForEachFanin( pObj, pFanin, k )
                if ( vPiNames && Nwk_ObjIsPi(pFanin) )
                    fprintf( pFile, " %s", (char*)Vec_PtrEntry(vPiNames, Nwk_ObjPioNum(pFanin)) );
                else
                    fprintf( pFile, " n%0*d", nDigits, pFanin->Id );
        }
        fprintf( pFile, " n%0*d\n", nDigits, pObj->Id );
        // write the function
        fprintf( pFile, "%s", pSop );
    }
    Vec_IntFree( vCover );
    Vec_IntFree( vTruth );
    Vec_PtrFree( vNodes );
    Aig_MmFlexStop( pMem, 0 );
    // write POs
    Nwk_ManForEachCo( pNtk, pObj, i )
    {
        fprintf( pFile, ".names" );
        if ( vPiNames && Nwk_ObjIsPi(Nwk_ObjFanin0(pObj)) )
            fprintf( pFile, " %s", (char*)Vec_PtrEntry(vPiNames, Nwk_ObjPioNum(Nwk_ObjFanin0(pObj))) );
        else
            fprintf( pFile, " n%0*d", nDigits, Nwk_ObjFanin0(pObj)->Id );
        if ( vPoNames )
            fprintf( pFile, " %s\n", (char*)Vec_PtrEntry(vPoNames, Nwk_ObjPioNum(pObj)) );
        else
            fprintf( pFile, " n%0*d\n", nDigits, pObj->Id );
        fprintf( pFile, "%d 1\n", !pObj->fInvert );
    }
    fprintf( pFile, ".end\n\n" );
    fclose( pFile );
}